

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool CheckPubKeyEncoding(valtype *vchPubKey,uint flags,SigVersion *sigversion,ScriptError *serror)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  bool bVar4;
  ScriptError SVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((flags & 2) == 0) goto LAB_0042bcc9;
  pbVar3 = (vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pbVar3;
  if (uVar6 < 0x21) {
LAB_0042bd06:
    SVar5 = SCRIPT_ERR_PUBKEYTYPE;
  }
  else {
    bVar1 = *pbVar3;
    if (bVar1 - 2 < 2) {
      if (uVar6 != 0x21) goto LAB_0042bd06;
    }
    else if ((bVar1 != 4) || (uVar6 != 0x41)) goto LAB_0042bd06;
LAB_0042bcc9:
    bVar4 = true;
    if (((-1 < (short)flags) || (*sigversion != WITNESS_V0)) ||
       ((pbVar3 = (vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start,
        (long)(vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
              .super__Vector_impl_data._M_finish - (long)pbVar3 == 0x21 && ((*pbVar3 & 0xfe) == 2)))
       ) goto LAB_0042bd14;
    SVar5 = SCRIPT_ERR_WITNESS_PUBKEYTYPE;
  }
  if (serror != (ScriptError *)0x0) {
    *serror = SVar5;
  }
  bVar4 = false;
LAB_0042bd14:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool static CheckPubKeyEncoding(const valtype &vchPubKey, unsigned int flags, const SigVersion &sigversion, ScriptError* serror) {
    if ((flags & SCRIPT_VERIFY_STRICTENC) != 0 && !IsCompressedOrUncompressedPubKey(vchPubKey)) {
        return set_error(serror, SCRIPT_ERR_PUBKEYTYPE);
    }
    // Only compressed keys are accepted in segwit
    if ((flags & SCRIPT_VERIFY_WITNESS_PUBKEYTYPE) != 0 && sigversion == SigVersion::WITNESS_V0 && !IsCompressedPubKey(vchPubKey)) {
        return set_error(serror, SCRIPT_ERR_WITNESS_PUBKEYTYPE);
    }
    return true;
}